

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

int build_grammar(Grammar *g)

{
  byte *pbVar1;
  VecAction *v;
  Action **ppAVar2;
  AssocKind AVar3;
  TermKind TVar4;
  Term **ppTVar5;
  Production **ppPVar6;
  Declaration *pDVar7;
  Term *pTVar8;
  State *pSVar9;
  Item **ppIVar10;
  Item *pIVar11;
  Action **ppAVar12;
  ElemKind EVar13;
  int iVar14;
  Production *pPVar15;
  Elem *pEVar16;
  Rule *pRVar17;
  Production *pPVar18;
  State *pSVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  State *pSVar23;
  ulong uVar24;
  Action *pAVar25;
  char *pcVar26;
  uint uVar27;
  uint uVar28;
  Elem **ppEVar29;
  byte bVar30;
  ulong uVar31;
  ulong uVar32;
  Term *pTVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  char str [256];
  Production *local_178;
  Production *local_168;
  char local_138 [264];
  
  g->rule_index = 0;
  if ((g->productions).n == 0) {
    uVar22 = 0;
  }
  else {
    uVar21 = 0;
    do {
      pPVar18 = (g->productions).v[uVar21];
      pPVar15 = lookup_production(g,pPVar18->name,pPVar18->name_len);
      if (pPVar18 != pPVar15) {
        d_fail("duplicate production \'%s\'");
      }
      pPVar18->index = (uint)uVar21;
      if ((pPVar18->rules).n != 0) {
        uVar22 = 0;
        do {
          pRVar17 = (pPVar18->rules).v[uVar22];
          uVar27 = g->rule_index;
          g->rule_index = uVar27 + 1;
          pRVar17->index = uVar27;
          if ((pRVar17->elems).n == 0) {
            pRVar17->end->index = 0;
          }
          else {
            uVar34 = 0;
            local_168 = (Production *)0x0;
            do {
              pEVar16 = (pRVar17->elems).v[uVar34];
              pEVar16->index = (uint)uVar34;
              EVar13 = pEVar16->kind;
              if (EVar13 == ELEM_UNRESOLVED) {
                uVar28 = (pEVar16->e).unresolved.len;
                pcVar26 = (pEVar16->e).unresolved.string;
                pPVar15 = lookup_production(g,pcVar26,uVar28);
                if (pPVar15 == (Production *)0x0) {
                  uVar32 = (ulong)(g->terminals).n;
                  if (uVar32 != 0) {
                    ppTVar5 = (g->terminals).v;
                    uVar24 = 0;
                    do {
                      pPVar15 = (Production *)ppTVar5[uVar24];
                      if (((*(int *)&pPVar15->name == 3) &&
                          (*(uint *)((pPVar15->rules).e + 1) == uVar28)) &&
                         (iVar14 = strncmp((char *)(pPVar15->rules).e[0],pcVar26,(long)(int)uVar28),
                         iVar14 == 0)) {
                        free(pcVar26);
                        pEVar16->kind = ELEM_TERM;
                        (pEVar16->e).term = (Term *)pPVar15;
                        local_168 = pPVar15;
                        goto LAB_0013bae9;
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar32 != uVar24);
                  }
                  strncpy(local_138,pcVar26,(ulong)uVar28);
                  uVar32 = 0xff;
                  if (uVar28 < 0xff) {
                    uVar32 = (ulong)uVar28;
                  }
                  local_138[uVar32] = '\0';
                  d_fail("unresolved identifier: \'%s\'");
                  EVar13 = pEVar16->kind;
                  goto LAB_0013badb;
                }
                free(pcVar26);
                pEVar16->kind = ELEM_NTERM;
                (pEVar16->e).nterm = pPVar15;
              }
              else {
LAB_0013badb:
                if (EVar13 == ELEM_TERM) {
                  local_168 = (pEVar16->e).nterm;
                }
              }
LAB_0013bae9:
              uVar34 = uVar34 + 1;
              uVar28 = (pRVar17->elems).n;
            } while (uVar34 < uVar28);
            pRVar17->end->index = uVar28;
            if (((g->set_op_priority_from_rule != 0) && (local_168 != (Production *)0x0)) &&
               (pRVar17->rule_assoc != ASSOC_NONE)) {
              *(AssocKind *)&(local_168->rules).v = pRVar17->rule_assoc;
              *(int *)((long)&(local_168->rules).v + 4) = pRVar17->rule_priority;
            }
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < (pPVar18->rules).n);
      }
      uVar21 = uVar21 + 1;
      uVar22 = (ulong)(g->productions).n;
    } while (uVar21 < uVar22);
  }
  uVar21 = (ulong)(g->terminals).n;
  if (uVar21 != 0) {
    ppTVar5 = (g->terminals).v;
    uVar34 = 0;
    do {
      ppTVar5[uVar34]->index = (uint)uVar34;
      uVar34 = uVar34 + 1;
    } while (uVar21 != uVar34);
  }
  if ((int)uVar22 != 0) {
    ppPVar6 = (g->productions).v;
    uVar21 = 0;
    do {
      pPVar18 = ppPVar6[uVar21];
      uVar34 = (ulong)(pPVar18->rules).n;
      if (uVar34 != 0) {
        uVar32 = 0;
        do {
          pRVar17 = (pPVar18->rules).v[uVar32];
          if ((pRVar17->elems).n == 0) {
            pPVar18->nullable = pRVar17;
            break;
          }
          uVar32 = uVar32 + 1;
        } while (uVar34 != uVar32);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar22);
    uVar21 = 0;
    bVar35 = false;
    do {
      do {
        bVar36 = bVar35;
        pPVar18 = ppPVar6[uVar21];
        if ((pPVar18->nullable == (Rule *)0x0) && ((pPVar18->rules).n != 0)) {
          pRVar17 = *(pPVar18->rules).v;
          uVar34 = (ulong)(pRVar17->elems).n;
          if (uVar34 != 0) {
            uVar32 = 0;
            do {
              pEVar16 = (pRVar17->elems).v[uVar32];
              if ((pEVar16->kind != ELEM_NTERM) || (((pEVar16->e).nterm)->nullable == (Rule *)0x0))
              goto LAB_0013bc05;
              uVar32 = uVar32 + 1;
            } while (uVar34 != uVar32);
          }
          pPVar18->nullable = pRVar17;
          bVar36 = true;
        }
LAB_0013bc05:
        uVar21 = uVar21 + 1;
        bVar35 = bVar36;
      } while (uVar21 != uVar22);
      uVar21 = 0;
      bVar35 = false;
    } while (bVar36);
    if ((int)uVar22 != 0) {
      uVar21 = 0;
      do {
        pPVar18 = (g->productions).v[uVar21];
        if ((pPVar18->field_0x3c & 1) != 0) {
          convert_regex_production_one(g,pPVar18);
          uVar22 = (ulong)(g->productions).n;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar22);
      if ((int)uVar22 != 0) {
        uVar21 = 0;
        do {
          pPVar18 = (g->productions).v[uVar21];
          uVar27 = (pPVar18->rules).n;
          if (uVar27 != 0) {
            uVar22 = 0;
            do {
              pRVar17 = (pPVar18->rules).v[uVar22];
              uVar28 = (pRVar17->elems).n;
              if (uVar28 != 0) {
                ppEVar29 = (pRVar17->elems).v;
                uVar34 = 0;
                do {
                  pEVar16 = ppEVar29[uVar34];
                  if ((pEVar16->kind == ELEM_NTERM) &&
                     (pPVar15 = (Production *)((pEVar16->e).nterm)->regex_term,
                     pPVar15 != (Production *)0x0)) {
                    (pEVar16->e).nterm = pPVar15;
                    ppEVar29 = (pRVar17->elems).v;
                    ppEVar29[uVar34]->kind = ELEM_TERM;
                    uVar28 = (pRVar17->elems).n;
                  }
                  uVar34 = uVar34 + 1;
                } while (uVar34 < uVar28);
                uVar27 = (pPVar18->rules).n;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < uVar27);
            uVar22 = (ulong)(g->productions).n;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar22);
        if ((int)uVar22 != 0) {
          uVar21 = 0;
          do {
            pPVar18 = (g->productions).v[uVar21];
            if ((pPVar18->rules).n != 0) {
              uVar22 = 0;
              do {
                pRVar17 = (pPVar18->rules).v[uVar22];
                uVar28 = (pRVar17->elems).n;
                if (1 < uVar28) {
                  ppEVar29 = (pRVar17->elems).v;
                  pEVar16 = *ppEVar29;
                  if (pEVar16->kind == ELEM_NTERM) {
                    bVar35 = (pEVar16->e).nterm == pPVar18;
                  }
                  else {
                    bVar35 = false;
                  }
                  pEVar16 = ppEVar29[uVar28 - 1];
                  if (pEVar16->kind == ELEM_NTERM) {
                    bVar36 = (pEVar16->e).nterm == pPVar18;
                  }
                  else {
                    bVar36 = false;
                  }
                  AVar3 = pRVar17->rule_assoc;
                  if ((AVar3 & 3) == ASSOC_NONE || (AVar3 & 4) == ASSOC_NONE) {
                    if ((AVar3 & 0x10) == ASSOC_NONE) {
LAB_0013bdb1:
                      if ((AVar3 & 8) == ASSOC_NONE) goto LAB_0013be99;
                      if ((AVar3 & 2) == ASSOC_NONE || bVar36) {
                        if ((AVar3 & 1) == ASSOC_NONE || bVar35) goto LAB_0013be99;
                        pcVar26 = "left unary rule must have left recursive nterm";
                      }
                      else {
                        pcVar26 = "right unary rule must have right recursive nterm";
                      }
                    }
                    else if ((AVar3 & 2) == ASSOC_NONE || bVar36) {
                      if ((AVar3 & 1) == ASSOC_NONE || bVar35) goto LAB_0013bdb1;
                      pcVar26 = "left binary rule must have left recursive nterm";
                    }
                    else {
                      pcVar26 = "right binary rule must have right recursive nterm";
                    }
                    d_fail(pcVar26);
                  }
                  else if ((bool)(bVar35 & bVar36)) {
                    if (AVar3 == ASSOC_NARY_RIGHT) {
                      pRVar17->rule_assoc = ASSOC_BINARY_RIGHT;
                    }
                    else if (AVar3 == ASSOC_NARY_LEFT) {
                      pRVar17->rule_assoc = ASSOC_BINARY_LEFT;
                    }
                  }
                  else if (bVar35) {
                    if (AVar3 == ASSOC_NARY_RIGHT) {
                      d_fail("nary rule with right associativity cannot have left recursive nterm");
                    }
                    pRVar17->rule_assoc = ASSOC_UNARY_LEFT;
                  }
                  else if (bVar36) {
                    if (AVar3 == ASSOC_NARY_LEFT) {
                      d_fail("nary rule with left associativity cannot have right recursive nterm");
                    }
                    pRVar17->rule_assoc = ASSOC_UNARY_RIGHT;
                  }
                }
LAB_0013be99:
                uVar22 = uVar22 + 1;
              } while (uVar22 < (pPVar18->rules).n);
              uVar22 = (ulong)(g->productions).n;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar22);
        }
      }
    }
  }
  pPVar18 = *(g->productions).v;
  if (g->tokenizer != 0) {
    pEVar16 = (Elem *)calloc(1,0x20);
    (pEVar16->e).nterm = pPVar18;
    new_declaration(g,pEVar16,0);
  }
  if (g->longest_match != 0) {
    pPVar15 = *(g->productions).v;
    pEVar16 = (Elem *)calloc(1,0x20);
    (pEVar16->e).nterm = pPVar15;
    new_declaration(g,pEVar16,1);
  }
  uVar28 = (g->declarations).n;
  if (uVar28 != 0) {
    uVar22 = 0;
    do {
      pEVar16 = (g->declarations).v[uVar22]->elem;
      if (pEVar16->kind == ELEM_UNRESOLVED) {
        uVar27 = (pEVar16->e).unresolved.len;
        if (uVar27 == 0) {
          pPVar15 = *(g->productions).v;
        }
        else {
          pcVar26 = (pEVar16->e).unresolved.string;
          pPVar15 = lookup_production(g,pcVar26,uVar27);
          if (pPVar15 == (Production *)0x0) {
            d_fail("unresolved declaration \'%s\'",pcVar26);
            pPVar15 = (Production *)0x0;
          }
        }
        free((pEVar16->e).term_or_nterm);
        pEVar16->kind = ELEM_NTERM;
        (pEVar16->e).nterm = pPVar15;
        uVar28 = (g->declarations).n;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar28);
    if (uVar28 != 0) {
      uVar22 = 0;
      do {
        pDVar7 = (g->declarations).v[uVar22];
        if (pDVar7->kind < 3) {
          pPVar15 = (pDVar7->elem->e).nterm;
          if (pPVar15 == pPVar18) {
            uVar21 = (ulong)(g->productions).n;
            if (uVar21 != 0) {
              uVar34 = 0;
              do {
                (g->productions).v[uVar34]->declaration_group[(g->declarations).v[uVar22]->kind] =
                     pPVar18;
                pDVar7 = (g->declarations).v[uVar22];
                (g->productions).v[uVar34]->last_declaration[pDVar7->kind] = pDVar7;
                uVar34 = uVar34 + 1;
              } while (uVar21 != uVar34);
            }
          }
          else {
            set_declaration_group(pPVar15,pPVar15,pDVar7);
            uVar28 = (g->declarations).n;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < uVar28);
    }
  }
  uVar28 = (g->productions).n;
  uVar22 = (ulong)uVar28;
  if (uVar28 != 0) {
    uVar21 = 0;
    do {
      pPVar18 = (g->productions).v[uVar21];
      uVar28 = (pPVar18->rules).n;
      uVar34 = (ulong)uVar28;
      if (uVar28 != 0) {
        uVar22 = 0;
        do {
          pRVar17 = (pPVar18->rules).v[uVar22];
          if ((pRVar17->elems).n != 0) {
            uVar34 = 0;
            do {
              pEVar16 = (pRVar17->elems).v[uVar34];
              if (pEVar16->kind == ELEM_TERM) {
                if (pPVar18->declaration_group[1] == (Production *)0x0) {
                  pbVar1 = (byte *)((long)(((pEVar16->e).nterm)->rules).e + 0xc);
                  *pbVar1 = *pbVar1 & 0xf8;
                }
                else {
                  if (pPVar18->declaration_group[2] == (Production *)0x0) {
                    pPVar15 = (pEVar16->e).nterm;
                    bVar30 = (*(byte *)((long)(pPVar15->rules).e + 0xc) & 0xf8) + 1;
                  }
                  else {
                    pPVar15 = (pEVar16->e).nterm;
                    bVar30 = *(byte *)((long)(pPVar15->rules).e + 0xc) & 0xf8;
                    if (pPVar18->last_declaration[2]->index < pPVar18->last_declaration[1]->index) {
                      bVar30 = bVar30 | 1;
                    }
                  }
                  *(byte *)((long)(pPVar15->rules).e + 0xc) = bVar30;
                }
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 < (pRVar17->elems).n);
            uVar34 = (ulong)(pPVar18->rules).n;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < uVar34);
        uVar22 = (ulong)(g->productions).n;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar22);
    if ((int)uVar22 != 0) {
      uVar21 = 0;
      do {
        pPVar18 = (g->productions).v[uVar21];
        uVar28 = (pPVar18->rules).n;
        if (uVar28 != 0) {
          uVar22 = 0;
          do {
            pRVar17 = (pPVar18->rules).v[uVar22];
            uVar20 = (pRVar17->elems).n;
            if (uVar20 != 0) {
              uVar34 = 0;
              do {
                pEVar16 = (pRVar17->elems).v[uVar34];
                if (pEVar16->kind == ELEM_TERM) {
                  pTVar8 = (pEVar16->e).term;
                  uVar32 = (ulong)(g->terminals).n;
                  pTVar33 = pTVar8;
                  if (uVar32 != 0) {
                    TVar4 = pTVar8->kind;
                    ppTVar5 = (g->terminals).v;
                    uVar24 = 0;
                    do {
                      pTVar33 = ppTVar5[uVar24];
                      if ((((((TVar4 == pTVar33->kind) &&
                             (pTVar8->string_len == pTVar33->string_len)) &&
                            (pTVar8->term_priority == pTVar33->term_priority)) &&
                           (pTVar8->term_name == pTVar33->term_name)) &&
                          ((g->set_op_priority_from_rule == 0 ||
                           ((pTVar8->op_assoc == pTVar33->op_assoc &&
                            (pTVar8->op_priority == pTVar33->op_priority)))))) &&
                         (iVar14 = strncmp(pTVar8->string,pTVar33->string,(long)pTVar8->string_len),
                         iVar14 == 0)) break;
                      uVar24 = uVar24 + 1;
                      pTVar33 = pTVar8;
                    } while (uVar32 != uVar24);
                  }
                  (pEVar16->e).term = pTVar33;
                  uVar20 = (pRVar17->elems).n;
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 < uVar20);
              uVar28 = (pPVar18->rules).n;
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < uVar28);
          uVar22 = (ulong)(g->productions).n;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar22);
      ppPVar6 = (g->productions).v;
      local_178 = *ppPVar6;
      if ((int)uVar22 != 0) {
        uVar21 = 0;
        do {
          if ((ppPVar6[uVar21]->field_0x3c & 0x1c) == 0) {
            if (g->states_for_all_nterms == 0) {
              uVar34 = (ulong)(g->declarations).n;
              if (uVar34 != 0) {
                uVar32 = 0;
                do {
                  pDVar7 = (g->declarations).v[uVar32];
                  if ((pDVar7->kind == 5) && (uVar21 == ((pDVar7->elem->e).nterm)->index))
                  goto LAB_0013c2b4;
                  uVar32 = uVar32 + 1;
                } while (uVar34 != uVar32);
              }
            }
            else {
LAB_0013c2b4:
              uVar34 = 0;
              do {
                pPVar18 = ppPVar6[uVar34];
                if ((pPVar18->rules).n != 0) {
                  uVar32 = 0;
                  do {
                    pRVar17 = (pPVar18->rules).v[uVar32];
                    uVar24 = (ulong)(pRVar17->elems).n;
                    if (uVar24 != 0) {
                      uVar31 = 0;
                      do {
                        pEVar16 = (pRVar17->elems).v[uVar31];
                        if ((pEVar16->e).nterm == ppPVar6[uVar21]) {
                          ppPVar6[uVar21]->elem = pEVar16;
                          pPVar18 = ppPVar6[uVar34];
                          break;
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar24 != uVar31);
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 < (pPVar18->rules).n);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar22);
              pPVar18 = ppPVar6[uVar21];
              pRVar17 = (Rule *)calloc(1,0xa8);
              pRVar17->prod = local_178;
              pEVar16 = (Elem *)calloc(1,0x20);
              pRVar17->end = pEVar16;
              pEVar16->kind = ELEM_END;
              pEVar16->rule = pRVar17;
              pRVar17->action_index = g->action_index;
              pEVar16 = (Elem *)calloc(1,0x20);
              (pEVar16->e).nterm = pPVar18;
              pEVar16->rule = pRVar17;
              pPVar18->elem = pEVar16;
              uVar27 = g->rule_index;
              g->rule_index = uVar27 + 1;
              ppPVar6[uVar21]->elem->rule->index = uVar27;
            }
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
      }
      goto LAB_0013c3ff;
    }
  }
  local_178 = *(g->productions).v;
LAB_0013c3ff:
  if (((g->states_for_all_nterms == 0) && (g->states_for_whitespace != 0)) &&
     (pPVar18 = lookup_production(g,"whitespace",10), pPVar18 != (Production *)0x0)) {
    pRVar17 = (Rule *)calloc(1,0xa8);
    pRVar17->prod = local_178;
    pEVar16 = (Elem *)calloc(1,0x20);
    pRVar17->end = pEVar16;
    pEVar16->kind = ELEM_END;
    pEVar16->rule = pRVar17;
    pRVar17->action_index = g->action_index;
    pEVar16 = (Elem *)calloc(1,0x20);
    (pEVar16->e).nterm = pPVar18;
    pEVar16->rule = pRVar17;
    pPVar18->elem = pEVar16;
    uVar27 = g->rule_index;
    g->rule_index = uVar27 + 1;
    pRVar17->index = uVar27;
  }
  pPVar18 = lookup_production(g,"_",1);
  if ((pPVar18 != (Production *)0x0) && (1 < (pPVar18->rules).n)) {
    d_fail("number of rules in default action != 1");
  }
  build_LR_tables(g);
  if ((g->states).n == 0) {
    uVar22 = 0;
  }
  else {
    uVar21 = 0;
    do {
      pSVar23 = (g->states).v[uVar21];
      pSVar23->field_0x178 = pSVar23->field_0x178 & 199 | 0x20;
      uVar21 = uVar21 + 1;
      uVar22 = (ulong)(g->states).n;
    } while (uVar21 < uVar22);
  }
  uVar28 = (g->declarations).n;
  if (uVar28 == 0) {
LAB_0013c735:
    if ((int)uVar22 != 0) {
      uVar21 = 0;
      do {
        pSVar23 = (g->states).v[uVar21];
        bVar30 = pSVar23->field_0x178;
        if ((bVar30 & 0x38) == 0x20) {
          pSVar23->field_0x178 = bVar30 & 199;
          uVar22 = (ulong)(g->states).n;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar22);
    }
    if ((d_verbose_level != 0) &&
       (printf("%d productions %d terminals %d states %d declarations\n",(ulong)(g->productions).n,
               (ulong)(g->terminals).n,uVar22,(ulong)(g->declarations).n), 1 < d_verbose_level)) {
      print_grammar(g);
      print_states(g);
    }
    build_scanners(g);
    build_eq(g);
    return 0;
  }
  uVar34 = 0;
  uVar21 = uVar22;
LAB_0013c53b:
  pDVar7 = (g->declarations).v[uVar34];
  uVar20 = pDVar7->kind;
  if (uVar20 < 3) {
    if ((int)uVar21 != 0) {
      uVar21 = 0;
      pSVar23 = (State *)0x0;
      do {
        pSVar9 = (g->states).v[uVar21];
        pSVar19 = pSVar23;
        if (((uVar20 == 0) && (pSVar19 = pSVar9, pSVar23 != (State *)0x0)) &&
           (pSVar9->same_shifts = pSVar23, pSVar19 = pSVar23, (pSVar9->shift_actions).n != 0)) {
          v = &pSVar23->shift_actions;
          ppAVar2 = (pSVar23->shift_actions).e;
          uVar22 = 0;
          do {
            uVar28 = (pSVar23->shift_actions).n;
            uVar32 = (ulong)uVar28;
            ppAVar12 = (pSVar23->shift_actions).v;
            if (uVar32 == 0) {
              if (ppAVar12 != (Action **)0x0) {
                pAVar25 = (pSVar9->shift_actions).v[uVar22];
                if (ppAVar12 == ppAVar2) {
                  uVar32 = 0;
                  goto LAB_0013c6dd;
                }
                goto LAB_0013c6e8;
              }
              pAVar25 = (pSVar9->shift_actions).v[uVar22];
              (pSVar23->shift_actions).v = ppAVar2;
              (pSVar23->shift_actions).n = 1;
              (pSVar23->shift_actions).e[0] = pAVar25;
            }
            else {
              pAVar25 = (pSVar9->shift_actions).v[uVar22];
              uVar24 = 0;
              do {
                if (pAVar25->term == ppAVar12[uVar24]->term) goto LAB_0013c6f0;
                uVar24 = uVar24 + 1;
              } while (uVar32 != uVar24);
              if (ppAVar12 == ppAVar2) {
                if (2 < uVar28) goto LAB_0013c6e8;
LAB_0013c6dd:
                v->n = uVar28 + 1;
                ppAVar12[uVar32] = pAVar25;
              }
              else if ((uVar28 & 7) == 0) {
LAB_0013c6e8:
                vec_add_internal(v,pAVar25);
              }
              else {
                v->n = uVar28 + 1;
                ppAVar12[uVar32] = pAVar25;
              }
            }
LAB_0013c6f0:
            uVar22 = uVar22 + 1;
          } while (uVar22 < (pSVar9->shift_actions).n);
        }
        uVar22 = (ulong)(pSVar9->items).n;
        if (uVar22 != 0) {
          ppIVar10 = (pSVar9->items).v;
          uVar32 = 0;
          do {
            pIVar11 = ppIVar10[uVar32];
            if (pIVar11->kind == ELEM_TERM) {
              bVar30 = *(byte *)((long)(((pIVar11->e).nterm)->rules).e + 0xc);
              if ((bVar30 & 7) == 0) {
                bVar30 = (byte)*(uint *)&pSVar9->field_0x178;
                if ((*(uint *)&pSVar9->field_0x178 >> 3 & 3) == 0) {
                  bVar30 = bVar30 & 199;
                }
                else {
LAB_0013c5e8:
                  bVar30 = bVar30 & 199 | 0x10;
                }
              }
              else {
                if ((bVar30 & 7) != 1) goto LAB_0013c5f7;
                bVar30 = (byte)*(uint *)&pSVar9->field_0x178;
                uVar28 = *(uint *)&pSVar9->field_0x178 >> 3 & 7;
                if ((uVar28 != 4) && (uVar28 != 1)) goto LAB_0013c5e8;
                bVar30 = bVar30 & 199 | 8;
              }
              pSVar9->field_0x178 = bVar30;
            }
LAB_0013c5f7:
            uVar32 = uVar32 + 1;
          } while (uVar22 != uVar32);
        }
        uVar21 = uVar21 + 1;
        uVar20 = (g->states).n;
        uVar22 = (ulong)uVar20;
        if (uVar22 <= uVar21) goto LAB_0013c714;
        uVar20 = pDVar7->kind;
        pSVar23 = pSVar19;
      } while( true );
    }
    uVar21 = 0;
  }
  goto LAB_0013c727;
LAB_0013c714:
  uVar28 = (g->declarations).n;
  uVar21 = (ulong)uVar20;
LAB_0013c727:
  uVar34 = uVar34 + 1;
  if (uVar28 <= uVar34) goto LAB_0013c735;
  goto LAB_0013c53b;
}

Assistant:

static void resolve_grammar(Grammar *g) {
  uint i, j, k, l;
  Production *p, *pp;
  Rule *r;
  Elem *e;
  Term *last_term, *t;

  g->rule_index = 0;
  for (i = 0; i < g->productions.n; i++) {
    p = g->productions.v[i];
    if (p != lookup_production(g, p->name, p->name_len)) d_fail("duplicate production '%s'", p->name);
    p->index = i;
    for (j = 0; j < p->rules.n; j++) {
      r = p->rules.v[j];
      r->index = g->rule_index++;
      last_term = NULL;
      for (k = 0; k < r->elems.n; k++) {
        e = r->elems.v[k];
        e->index = k;
        if (e->kind == ELEM_UNRESOLVED) {
          l = e->e.unresolved.len;
          if ((pp = lookup_production(g, e->e.unresolved.string, l))) {
            FREE(e->e.unresolved.string);
            e->e.unresolved.string = 0;
            e->kind = ELEM_NTERM;
            e->e.nterm = pp;
          } else if ((t = lookup_token(g, e->e.unresolved.string, l))) {
            FREE(e->e.unresolved.string);
            e->e.unresolved.string = 0;
            e->kind = ELEM_TERM;
            e->e.term = t;
          } else {
            char str[256];
            strncpy(str, e->e.unresolved.string, l);
            str[l < 255 ? l : 255] = 0;
            d_fail("unresolved identifier: '%s'", str);
          }
        }
        if (e->kind == ELEM_TERM) last_term = e->e.term;
      }
      r->end->index = r->elems.n;
      if (g->set_op_priority_from_rule) {
        if (last_term && r->rule_assoc) {
          last_term->op_assoc = r->rule_assoc;
          last_term->op_priority = r->rule_priority;
        }
      }
    }
  }
  for (i = 0; i < g->terminals.n; i++) g->terminals.v[i]->index = i;
  compute_nullable(g);
}